

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

void __thiscall S2Builder::Reset(S2Builder *this)

{
  S2Builder *this_local;
  
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::clear(&this->input_vertices_);
  std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::clear
            (&this->input_edges_);
  std::
  vector<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>,_std::allocator<std::unique_ptr<S2Builder::Layer,_std::default_delete<S2Builder::Layer>_>_>_>
  ::clear(&this->layers_);
  std::vector<S2Builder::GraphOptions,_std::allocator<S2Builder::GraphOptions>_>::clear
            (&this->layer_options_);
  std::vector<int,_std::allocator<int>_>::clear(&this->layer_begins_);
  std::
  vector<std::function<bool_(const_S2Builder::Graph_&,_S2Error_*)>,_std::allocator<std::function<bool_(const_S2Builder::Graph_&,_S2Error_*)>_>_>
  ::clear(&this->layer_is_full_polygon_predicates_);
  std::vector<int,_std::allocator<int>_>::clear(&this->label_set_ids_);
  IdSetLexicon::Clear(&this->label_set_lexicon_);
  std::vector<int,_std::allocator<int>_>::clear(&this->label_set_);
  this->label_set_modified_ = false;
  std::vector<Vector3<double>,_std::allocator<Vector3<double>_>_>::clear(&this->sites_);
  std::
  vector<gtl::compact_array<int,_std::allocator<int>_>,_std::allocator<gtl::compact_array<int,_std::allocator<int>_>_>_>
  ::clear(&this->edge_sites_);
  this->snapping_needed_ = false;
  return;
}

Assistant:

void S2Builder::Reset() {
  input_vertices_.clear();
  input_edges_.clear();
  layers_.clear();
  layer_options_.clear();
  layer_begins_.clear();
  layer_is_full_polygon_predicates_.clear();
  label_set_ids_.clear();
  label_set_lexicon_.Clear();
  label_set_.clear();
  label_set_modified_ = false;
  sites_.clear();
  edge_sites_.clear();
  snapping_needed_ = false;
}